

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::internal::parse_nonnegative_int<wchar_t>(wchar_t **s)

{
  wchar_t *pwVar1;
  uint uVar2;
  FormatError *this;
  uint uVar3;
  wchar_t *pwVar4;
  
  uVar2 = 0;
  pwVar1 = *s;
  do {
    pwVar4 = pwVar1 + 1;
    uVar3 = (*pwVar1 + uVar2 * 10) - 0x30;
    if (uVar3 < uVar2) {
      uVar3 = 0xffffffff;
      break;
    }
    uVar2 = uVar3;
    pwVar1 = pwVar4;
  } while ((uint)(*pwVar4 + L'\xffffffd0') < 10);
  *s = pwVar4;
  if ((int)uVar3 < 0) {
    this = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this,(CStringRef)0x13b227);
    __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return uVar3;
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  do {
    unsigned new_value = value * 10 + (*s++ - '0');
    // Check if value wrapped around.
    if (new_value < value) {
      value = (std::numeric_limits<unsigned>::max)();
      break;
    }
    value = new_value;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}